

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

Object * resolveExpression(Object *__return_storage_ptr__,Expression *expression,Environment *env)

{
  Variable expr;
  Environment *env_local;
  Expression *expression_local;
  
  switch(expression->type) {
  case EXPR_BINARY:
    resolveBinary(__return_storage_ptr__,(expression->field_1).binary,env);
    break;
  case EXPR_LOGICAL:
    resolveLogical(__return_storage_ptr__,(expression->field_1).logical,env);
    break;
  case EXPR_LITERAL:
    fromLiteral(__return_storage_ptr__,(expression->field_1).literal);
    break;
  case EXPR_VARIABLE:
    expr._4_4_ = 0;
    expr.line = (expression->field_1).binary.line;
    expr.name = (char *)(expression->field_1).binary.left;
    resolveVariable(__return_storage_ptr__,expr,env);
    break;
  case EXPR_ARRAY:
    resolveArray(__return_storage_ptr__,(expression->field_1).arrayExpression,env);
    break;
  case EXPR_CALL:
    resolveCall(__return_storage_ptr__,(expression->field_1).callExpression,env);
    break;
  case EXPR_REFERENCE:
    resolveReference(__return_storage_ptr__,(expression->field_1).referenceExpression,env);
    break;
  case EXPR_NONE:
    memcpy(__return_storage_ptr__,&nullObject,0x40);
  }
  return __return_storage_ptr__;
}

Assistant:

static Object resolveExpression(Expression* expression, Environment *env){
    //   printf("\nSolving expression : %s", expressionNames[expression->type]);
    switch(expression->type){
        case EXPR_LITERAL:
            return fromLiteral(expression->literal);
        case EXPR_BINARY:
            return resolveBinary(expression->binary, env);
        case EXPR_LOGICAL:
            return resolveLogical(expression->logical, env);
        case EXPR_NONE:
            return nullObject;
        case EXPR_VARIABLE:
            return resolveVariable(expression->variable, env);
        case EXPR_ARRAY:
            return resolveArray(expression->arrayExpression, env);
        case EXPR_CALL:
            return resolveCall(expression->callExpression, env);
        case EXPR_REFERENCE:
            return resolveReference(expression->referenceExpression, env);
    }
}